

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

size_t __thiscall
google::protobuf::internal::ExtensionSet::Extension::ByteSize(Extension *this,int number)

{
  byte bVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  size_t sVar6;
  const_reference plVar7;
  ulong uVar8;
  const_reference puVar9;
  ulong *puVar10;
  const_reference puVar11;
  const_reference piVar12;
  ulong uVar13;
  undefined4 in_register_00000034;
  LogMessageFatal local_30 [16];
  
  if (this->is_repeated == true) {
    bVar1 = this->type;
    if (this->is_packed == true) {
      switch((uint)bVar1) {
      case 1:
      case 6:
      case 0x10:
        uVar5 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                             (undefined1  [16])
                             ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0 &
                             (undefined1  [16])0x4) == (undefined1  [16])0x0);
        uVar13 = (ulong)uVar5 << 3;
        break;
      case 2:
      case 7:
      case 0xf:
        uVar5 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                             (undefined1  [16])
                             ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0 &
                             (undefined1  [16])0x4) == (undefined1  [16])0x0);
        uVar13 = (ulong)uVar5 << 2;
        break;
      case 3:
        iVar3 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                             (undefined1  [16])
                             ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0 &
                             (undefined1  [16])0x4) == (undefined1  [16])0x0);
        if (iVar3 < 1) {
LAB_0025e82a:
          *(undefined4 *)(this->cached_size).int_ = 0;
          return 0;
        }
        uVar13 = 0;
        iVar3 = 0;
        do {
          puVar10 = (ulong *)RepeatedField<long>::Get((RepeatedField<long> *)this->field_0,iVar3);
          lVar2 = 0x3f;
          if ((*puVar10 | 1) != 0) {
            for (; (*puVar10 | 1) >> lVar2 == 0; lVar2 = lVar2 + -1) {
            }
          }
          uVar13 = uVar13 + ((int)lVar2 * 9 + 0x49U >> 6);
          iVar3 = iVar3 + 1;
          iVar4 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                               (undefined1  [16])
                               ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0
                               & (undefined1  [16])0x4) == (undefined1  [16])0x0);
        } while (iVar3 < iVar4);
        break;
      case 4:
        iVar3 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                             (undefined1  [16])
                             ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0 &
                             (undefined1  [16])0x4) == (undefined1  [16])0x0);
        if (iVar3 < 1) goto LAB_0025e82a;
        uVar13 = 0;
        iVar3 = 0;
        do {
          puVar11 = RepeatedField<unsigned_long>::Get
                              ((RepeatedField<unsigned_long> *)this->field_0,iVar3);
          lVar2 = 0x3f;
          if ((*puVar11 | 1) != 0) {
            for (; (*puVar11 | 1) >> lVar2 == 0; lVar2 = lVar2 + -1) {
            }
          }
          uVar13 = uVar13 + ((int)lVar2 * 9 + 0x49U >> 6);
          iVar3 = iVar3 + 1;
          iVar4 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                               (undefined1  [16])
                               ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0
                               & (undefined1  [16])0x4) == (undefined1  [16])0x0);
        } while (iVar3 < iVar4);
        break;
      case 5:
        iVar3 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                             (undefined1  [16])
                             ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0 &
                             (undefined1  [16])0x4) == (undefined1  [16])0x0);
        if (iVar3 < 1) goto LAB_0025e82a;
        uVar13 = 0;
        iVar3 = 0;
        do {
          piVar12 = RepeatedField<int>::Get((RepeatedField<int> *)this->field_0,iVar3);
          lVar2 = 0x3f;
          if (((long)*piVar12 | 1U) != 0) {
            for (; ((long)*piVar12 | 1U) >> lVar2 == 0; lVar2 = lVar2 + -1) {
            }
          }
          uVar13 = uVar13 + ((int)lVar2 * 9 + 0x49U >> 6);
          iVar3 = iVar3 + 1;
          iVar4 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                               (undefined1  [16])
                               ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0
                               & (undefined1  [16])0x4) == (undefined1  [16])0x0);
        } while (iVar3 < iVar4);
        break;
      case 8:
        uVar5 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                             (undefined1  [16])
                             ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0 &
                             (undefined1  [16])0x4) == (undefined1  [16])0x0);
        uVar13 = (ulong)uVar5;
        break;
      case 9:
      case 10:
      case 0xb:
      case 0xc:
        absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                  (local_30,
                   "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/extension_set.cc"
                   ,0x592);
        absl::lts_20240722::log_internal::LogMessage::operator<<
                  ((LogMessage *)local_30,(char (*) [37])"Non-primitive types can\'t be packed.");
        goto LAB_0025ed4e;
      case 0xd:
        iVar3 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                             (undefined1  [16])
                             ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0 &
                             (undefined1  [16])0x4) == (undefined1  [16])0x0);
        if (iVar3 < 1) goto LAB_0025e82a;
        uVar13 = 0;
        iVar3 = 0;
        do {
          puVar9 = RepeatedField<unsigned_int>::Get
                             ((RepeatedField<unsigned_int> *)this->field_0,iVar3);
          iVar4 = 0x1f;
          if ((*puVar9 | 1) != 0) {
            for (; (*puVar9 | 1) >> iVar4 == 0; iVar4 = iVar4 + -1) {
            }
          }
          uVar13 = uVar13 + (iVar4 * 9 + 0x49U >> 6);
          iVar3 = iVar3 + 1;
          iVar4 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                               (undefined1  [16])
                               ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0
                               & (undefined1  [16])0x4) == (undefined1  [16])0x0);
        } while (iVar3 < iVar4);
        break;
      case 0xe:
        iVar3 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                             (undefined1  [16])
                             ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0 &
                             (undefined1  [16])0x4) == (undefined1  [16])0x0);
        if (iVar3 < 1) goto LAB_0025e82a;
        uVar13 = 0;
        iVar3 = 0;
        do {
          piVar12 = RepeatedField<int>::Get((RepeatedField<int> *)this->field_0,iVar3);
          lVar2 = 0x3f;
          if (((long)*piVar12 | 1U) != 0) {
            for (; ((long)*piVar12 | 1U) >> lVar2 == 0; lVar2 = lVar2 + -1) {
            }
          }
          uVar13 = uVar13 + ((int)lVar2 * 9 + 0x49U >> 6);
          iVar3 = iVar3 + 1;
          iVar4 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                               (undefined1  [16])
                               ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0
                               & (undefined1  [16])0x4) == (undefined1  [16])0x0);
        } while (iVar3 < iVar4);
        break;
      case 0x11:
        iVar3 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                             (undefined1  [16])
                             ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0 &
                             (undefined1  [16])0x4) == (undefined1  [16])0x0);
        if (iVar3 < 1) goto LAB_0025e82a;
        uVar13 = 0;
        iVar3 = 0;
        do {
          piVar12 = RepeatedField<int>::Get((RepeatedField<int> *)this->field_0,iVar3);
          uVar5 = *piVar12 >> 0x1f ^ *piVar12 * 2 | 1;
          iVar4 = 0x1f;
          if (uVar5 != 0) {
            for (; uVar5 >> iVar4 == 0; iVar4 = iVar4 + -1) {
            }
          }
          uVar13 = uVar13 + (iVar4 * 9 + 0x49U >> 6);
          iVar3 = iVar3 + 1;
          iVar4 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                               (undefined1  [16])
                               ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0
                               & (undefined1  [16])0x4) == (undefined1  [16])0x0);
        } while (iVar3 < iVar4);
        break;
      case 0x12:
        iVar3 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                             (undefined1  [16])
                             ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0 &
                             (undefined1  [16])0x4) == (undefined1  [16])0x0);
        if (iVar3 < 1) goto LAB_0025e82a;
        uVar13 = 0;
        iVar3 = 0;
        do {
          plVar7 = RepeatedField<long>::Get((RepeatedField<long> *)this->field_0,iVar3);
          uVar8 = *plVar7 >> 0x3f ^ *plVar7 * 2 | 1;
          lVar2 = 0x3f;
          if (uVar8 != 0) {
            for (; uVar8 >> lVar2 == 0; lVar2 = lVar2 + -1) {
            }
          }
          uVar13 = uVar13 + ((int)lVar2 * 9 + 0x49U >> 6);
          iVar3 = iVar3 + 1;
          iVar4 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                               (undefined1  [16])
                               ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0
                               & (undefined1  [16])0x4) == (undefined1  [16])0x0);
        } while (iVar3 < iVar4);
        break;
      default:
        ByteSize();
        goto LAB_0025ed3a;
      }
      *(uint *)(this->cached_size).int_ = (uint)uVar13;
      if (uVar13 == 0) {
        return 0;
      }
      uVar5 = (uint)uVar13 | 1;
      iVar3 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      uVar5 = number * 8 + 3;
      iVar4 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> iVar4 == 0; iVar4 = iVar4 + -1) {
        }
      }
      return uVar13 + (iVar4 * 9 + 0x49U >> 6) + (ulong)(iVar3 * 9 + 0x49U >> 6);
    }
    if (0xed < (byte)(bVar1 - 0x13)) {
      uVar5 = number * 8 + 1;
      iVar3 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      sVar6 = (*(code *)(&DAT_003b9634 + *(int *)(&DAT_003b9634 + (ulong)(bVar1 - 1) * 4)))();
      return sVar6;
    }
  }
  else {
    if ((this->field_0xa & 2) != 0) {
      return 0;
    }
    if (0xed < (byte)(this->type - 0x13)) {
      uVar5 = number * 8 + 1;
      iVar3 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      sVar6 = (*(code *)(&DAT_003b95ec + *(int *)(&DAT_003b95ec + (ulong)(this->type - 1) * 4)))
                        (this,CONCAT44(in_register_00000034,number),
                         &DAT_003b95ec + *(int *)(&DAT_003b95ec + (ulong)(this->type - 1) * 4));
      return sVar6;
    }
LAB_0025ed3a:
    ByteSize();
  }
  ByteSize();
LAB_0025ed4e:
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_30);
}

Assistant:

size_t ExtensionSet::Extension::ByteSize(int number) const {
  size_t result = 0;

  if (is_repeated) {
    if (is_packed) {
      switch (real_type(type)) {
#define HANDLE_TYPE(UPPERCASE, CAMELCASE, LOWERCASE)                     \
  case WireFormatLite::TYPE_##UPPERCASE:                                 \
    for (int i = 0; i < ptr.repeated_##LOWERCASE##_value->size(); i++) { \
      result += WireFormatLite::CAMELCASE##Size(                         \
          ptr.repeated_##LOWERCASE##_value->Get(i));                     \
    }                                                                    \
    break

        HANDLE_TYPE(INT32, Int32, int32_t);
        HANDLE_TYPE(INT64, Int64, int64_t);
        HANDLE_TYPE(UINT32, UInt32, uint32_t);
        HANDLE_TYPE(UINT64, UInt64, uint64_t);
        HANDLE_TYPE(SINT32, SInt32, int32_t);
        HANDLE_TYPE(SINT64, SInt64, int64_t);
        HANDLE_TYPE(ENUM, Enum, enum);
#undef HANDLE_TYPE

        // Stuff with fixed size.
#define HANDLE_TYPE(UPPERCASE, CAMELCASE, LOWERCASE)                 \
  case WireFormatLite::TYPE_##UPPERCASE:                             \
    result += WireFormatLite::k##CAMELCASE##Size *                   \
              FromIntSize(ptr.repeated_##LOWERCASE##_value->size()); \
    break
        HANDLE_TYPE(FIXED32, Fixed32, uint32_t);
        HANDLE_TYPE(FIXED64, Fixed64, uint64_t);
        HANDLE_TYPE(SFIXED32, SFixed32, int32_t);
        HANDLE_TYPE(SFIXED64, SFixed64, int64_t);
        HANDLE_TYPE(FLOAT, Float, float);
        HANDLE_TYPE(DOUBLE, Double, double);
        HANDLE_TYPE(BOOL, Bool, bool);
#undef HANDLE_TYPE

        case WireFormatLite::TYPE_STRING:
        case WireFormatLite::TYPE_BYTES:
        case WireFormatLite::TYPE_GROUP:
        case WireFormatLite::TYPE_MESSAGE:
          ABSL_LOG(FATAL) << "Non-primitive types can't be packed.";
          break;
      }

      cached_size.set(ToCachedSize(result));
      if (result > 0) {
        result += io::CodedOutputStream::VarintSize32(result);
        result += io::CodedOutputStream::VarintSize32(WireFormatLite::MakeTag(
            number, WireFormatLite::WIRETYPE_LENGTH_DELIMITED));
      }
    } else {
      size_t tag_size = WireFormatLite::TagSize(number, real_type(type));

      switch (real_type(type)) {
#define HANDLE_TYPE(UPPERCASE, CAMELCASE, LOWERCASE)                      \
  case WireFormatLite::TYPE_##UPPERCASE:                                  \
    result +=                                                             \
        tag_size * FromIntSize(ptr.repeated_##LOWERCASE##_value->size()); \
    for (int i = 0; i < ptr.repeated_##LOWERCASE##_value->size(); i++) {  \
      result += WireFormatLite::CAMELCASE##Size(                          \
          ptr.repeated_##LOWERCASE##_value->Get(i));                      \
    }                                                                     \
    break

        HANDLE_TYPE(INT32, Int32, int32_t);
        HANDLE_TYPE(INT64, Int64, int64_t);
        HANDLE_TYPE(UINT32, UInt32, uint32_t);
        HANDLE_TYPE(UINT64, UInt64, uint64_t);
        HANDLE_TYPE(SINT32, SInt32, int32_t);
        HANDLE_TYPE(SINT64, SInt64, int64_t);
        HANDLE_TYPE(STRING, String, string);
        HANDLE_TYPE(BYTES, Bytes, string);
        HANDLE_TYPE(ENUM, Enum, enum);
        HANDLE_TYPE(GROUP, Group, message);
        HANDLE_TYPE(MESSAGE, Message, message);
#undef HANDLE_TYPE

        // Stuff with fixed size.
#define HANDLE_TYPE(UPPERCASE, CAMELCASE, LOWERCASE)                 \
  case WireFormatLite::TYPE_##UPPERCASE:                             \
    result += (tag_size + WireFormatLite::k##CAMELCASE##Size) *      \
              FromIntSize(ptr.repeated_##LOWERCASE##_value->size()); \
    break
        HANDLE_TYPE(FIXED32, Fixed32, uint32_t);
        HANDLE_TYPE(FIXED64, Fixed64, uint64_t);
        HANDLE_TYPE(SFIXED32, SFixed32, int32_t);
        HANDLE_TYPE(SFIXED64, SFixed64, int64_t);
        HANDLE_TYPE(FLOAT, Float, float);
        HANDLE_TYPE(DOUBLE, Double, double);
        HANDLE_TYPE(BOOL, Bool, bool);
#undef HANDLE_TYPE
      }
    }
  } else if (!is_cleared) {
    result += WireFormatLite::TagSize(number, real_type(type));
    switch (real_type(type)) {
#define HANDLE_TYPE(UPPERCASE, CAMELCASE, LOWERCASE)      \
  case WireFormatLite::TYPE_##UPPERCASE:                  \
    result += WireFormatLite::CAMELCASE##Size(LOWERCASE); \
    break

      HANDLE_TYPE(INT32, Int32, int32_t_value);
      HANDLE_TYPE(INT64, Int64, int64_t_value);
      HANDLE_TYPE(UINT32, UInt32, uint32_t_value);
      HANDLE_TYPE(UINT64, UInt64, uint64_t_value);
      HANDLE_TYPE(SINT32, SInt32, int32_t_value);
      HANDLE_TYPE(SINT64, SInt64, int64_t_value);
      HANDLE_TYPE(STRING, String, *ptr.string_value);
      HANDLE_TYPE(BYTES, Bytes, *ptr.string_value);
      HANDLE_TYPE(ENUM, Enum, enum_value);
      HANDLE_TYPE(GROUP, Group, *ptr.message_value);
#undef HANDLE_TYPE
      case WireFormatLite::TYPE_MESSAGE: {
        result += WireFormatLite::LengthDelimitedSize(
            is_lazy ? ptr.lazymessage_value->ByteSizeLong()
                    : ptr.message_value->ByteSizeLong());
        break;
      }

      // Stuff with fixed size.
#define HANDLE_TYPE(UPPERCASE, CAMELCASE)         \
  case WireFormatLite::TYPE_##UPPERCASE:          \
    result += WireFormatLite::k##CAMELCASE##Size; \
    break
        HANDLE_TYPE(FIXED32, Fixed32);
        HANDLE_TYPE(FIXED64, Fixed64);
        HANDLE_TYPE(SFIXED32, SFixed32);
        HANDLE_TYPE(SFIXED64, SFixed64);
        HANDLE_TYPE(FLOAT, Float);
        HANDLE_TYPE(DOUBLE, Double);
        HANDLE_TYPE(BOOL, Bool);
#undef HANDLE_TYPE
    }
  }

  return result;
}